

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O2

Var Js::Math::Min(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  Var pvVar8;
  int32 current;
  uint idxArg_1;
  uint uVar9;
  uint idxArg;
  CallInfo value;
  int in_stack_00000010;
  CallInfo local_58;
  CallInfo callInfo_local;
  undefined1 local_48 [8];
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_58 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x312,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bd62d6;
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)local_48,&local_58,(Var *)&stack0x00000018);
  if ((local_48._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x313,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00bd62d6;
    *puVar7 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_58 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x317,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bd62d6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  if ((local_48._0_4_ & 0xffffff) < 2) {
    return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           positiveInfinite.ptr;
  }
  if ((local_48._0_4_ & 0xffffff) == 2) {
    pvVar8 = Arguments::operator[]((Arguments *)local_48,1);
    value = (CallInfo)JavascriptConversion::ToNumber(pvVar8,pSVar1);
  }
  else {
    bVar3 = TaggedInt::OnlyContainsTaggedInt((Arguments *)local_48);
    if (bVar3) {
      uVar9 = local_48._0_4_ & 0xffffff;
      pvVar8 = Arguments::operator[]((Arguments *)local_48,1);
      uVar4 = TaggedInt::ToInt32(pvVar8);
      if (uVar9 == 3) {
        pvVar8 = Arguments::operator[]((Arguments *)local_48,2);
        uVar5 = TaggedInt::ToInt32(pvVar8);
        if ((int)uVar4 < (int)uVar5) {
          uVar5 = uVar4;
        }
      }
      else {
        for (uVar9 = 2; uVar5 = uVar4, uVar9 < (local_48._0_4_ & 0xffffff); uVar9 = uVar9 + 1) {
          pvVar8 = Arguments::operator[]((Arguments *)local_48,uVar9);
          uVar5 = TaggedInt::ToInt32(pvVar8);
          if ((int)uVar5 <= (int)uVar4) {
            uVar4 = uVar5;
          }
        }
      }
      return (Var)((ulong)uVar5 | 0x1000000000000);
    }
    pvVar8 = Arguments::operator[]((Arguments *)local_48,1);
    args.super_Arguments.Values = (Type)JavascriptConversion::ToNumber(pvVar8,pSVar1);
    BVar6 = JavascriptNumber::IsNan((double)args.super_Arguments.Values);
    bVar3 = BVar6 != 0;
    value = (CallInfo)args.super_Arguments.Values;
    for (uVar4 = 2; uVar4 < (local_48._0_4_ & 0xffffff); uVar4 = uVar4 + 1) {
      args.super_Arguments.Values = (Type)value;
      pvVar8 = Arguments::operator[]((Arguments *)local_48,uVar4);
      callInfo_local = (CallInfo)JavascriptConversion::ToNumber(pvVar8,pSVar1);
      BVar6 = JavascriptNumber::IsNan((double)callInfo_local);
      if ((BVar6 != 0) || (bVar3)) {
        bVar3 = true;
        value = (CallInfo)args.super_Arguments.Values;
      }
      else if (((((double)args.super_Arguments.Values != 0.0) ||
                (NAN((double)args.super_Arguments.Values))) ||
               (BVar6 = JavascriptNumber::IsNegZero((double)callInfo_local), value = callInfo_local,
               BVar6 == 0)) &&
              (value = callInfo_local, (double)args.super_Arguments.Values <= (double)callInfo_local
              )) {
        value = (CallInfo)args.super_Arguments.Values;
      }
    }
    if (bVar3) {
      return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             nan.ptr;
    }
  }
  pvVar8 = JavascriptNumber::ToVarNoCheck((double)value,pSVar1);
  return pvVar8;
}

Assistant:

Var Math::Min(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();
        bool hasOnlyIntegerArgs = false;

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count <= 1)
        {
            return scriptContext->GetLibrary()->GetPositiveInfinite();
        }
        else if (args.Info.Count == 2)
        {
            double result = JavascriptConversion::ToNumber(args[1], scriptContext);
            return JavascriptNumber::ToVarNoCheck(result, scriptContext);
        }
        else
        {
            hasOnlyIntegerArgs = TaggedInt::OnlyContainsTaggedInt(args);
            if (hasOnlyIntegerArgs && args.Info.Count == 3)
            {
                return TaggedInt::ToVarUnchecked(min(TaggedInt::ToInt32(args[1]), TaggedInt::ToInt32(args[2])));
            }
        }

        if (hasOnlyIntegerArgs)
        {
            int32 current = TaggedInt::ToInt32(args[1]);
            for (uint idxArg = 2; idxArg < args.Info.Count; idxArg++)
            {
                int32 compare = TaggedInt::ToInt32(args[idxArg]);
                if (current > compare)
                {
                    current = compare;
                }
            }

            return TaggedInt::ToVarUnchecked(current);
        }
        else
        {
            double current = JavascriptConversion::ToNumber(args[1], scriptContext);

            bool returnNaN = false;
            if (JavascriptNumber::IsNan(current))
            {
                returnNaN = true;
            }

            for (uint idxArg = 2; idxArg < args.Info.Count; idxArg++)
            {
                double compare = JavascriptConversion::ToNumber(args[idxArg], scriptContext);
                if (JavascriptNumber::IsNan(compare) || returnNaN) // Call ToNumber for all args
                {
                    returnNaN = true;
                }

                // In C++, -0.0f == 0.0f; however, in ES, -0.0f < 0.0f. Thus, use additional library 
                // call to test this comparison.
                else if ((current == 0 && JavascriptNumber::IsNegZero(compare)) ||
                    current > compare)
                {
                    current = compare;
                }
            }

            if (returnNaN)
            {
                return scriptContext->GetLibrary()->GetNaN();
            }

            return JavascriptNumber::ToVarNoCheck(current, scriptContext);
        }
    }